

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void chatra::parseInnerNode
               (ParserWorkingSet *ws,IErrorReceiver *errorReceiver,
               shared_ptr<chatra::StringTable> *sTable,Node *node,bool recursive)

{
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *this;
  __node_base_ptr *this_00;
  pointer pbVar1;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  last;
  StringId SVar2;
  Token *pTVar3;
  Token *pTVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  StatementPatternElement *pSVar7;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  last_00;
  size_t sVar8;
  pointer psVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  pointer psVar10;
  undefined8 *puVar11;
  char *pcVar12;
  Node *node_00;
  shared_ptr<chatra::StringTable> *psVar13;
  element_type *peVar14;
  _Hash_node_base *p_Var15;
  bool bVar16;
  StatementPatternElement *e;
  __buckets_ptr pp_Var17;
  undefined1 auVar18 [8];
  bool bVar19;
  Node *__tmp;
  long lVar20;
  long *plVar21;
  iterator __position;
  element_type *peVar22;
  mapped_type *pmVar23;
  NodeType NVar24;
  _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var25;
  Token **ppTVar26;
  _Hash_node_base *p_Var27;
  size_t sVar28;
  Token **ppTVar29;
  ulong uVar30;
  undefined8 *puVar31;
  shared_ptr<chatra::Node> *n_1;
  Token **__dest;
  StatementPatternElement *pSVar32;
  pointer psVar33;
  ulong uVar34;
  pointer pbVar35;
  undefined7 in_register_00000081;
  __hash_code __code;
  Token **token;
  element_type *peVar36;
  undefined1 auVar37 [8];
  long lVar38;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  _Var39;
  undefined1 auVar40 [8];
  size_type *psVar41;
  undefined1 local_220 [8];
  AnnotationMap aMap;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_1a0 [23];
  undefined4 uStack_189;
  undefined1 uStack_185;
  undefined4 uStack_184;
  pointer local_180;
  undefined1 auStack_178 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> pending;
  undefined1 local_158 [36];
  undefined4 local_134;
  Node *local_130;
  undefined1 auStack_128 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> outNodes;
  ParserContext ct;
  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
  stack;
  undefined1 auStack_d8 [8];
  AnnotationMap a;
  undefined1 auStack_88 [8];
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  it;
  Token *local_78;
  _Map_pointer ppsStack_70;
  undefined1 auStack_68 [8];
  shared_ptr<chatra::Node> n;
  __node_base_ptr p_Stack_38;
  
  local_134 = (undefined4)CONCAT71(in_register_00000081,recursive);
  local_220 = (undefined1  [8])&aMap._M_h._M_rehash_policy._M_next_resize;
  aMap._M_h._M_buckets = (__buckets_ptr)0x1;
  aMap._M_h._M_bucket_count = 0;
  aMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  aMap._M_h._M_element_count._0_4_ = 0x3f800000;
  aMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  aMap._M_h._M_rehash_policy._4_4_ = 0;
  aMap._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_178 = (undefined1  [8])0x0;
  pending.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pending.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this = &node->blockNodes;
  __position._M_current =
       (node->blockNodes).
       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_130 = node;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ws;
  ct.ws = (ParserWorkingSet *)errorReceiver;
  ct.errorReceiver = (IErrorReceiver *)sTable;
  if (__position._M_current !=
      (node->blockNodes).
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      auStack_d8 = (undefined1  [8])&a._M_h._M_rehash_policy._M_next_resize;
      a._M_h._M_buckets = (__buckets_ptr)0x1;
      a._M_h._M_bucket_count = 0;
      a._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      a._M_h._M_element_count = CONCAT44(a._M_h._M_element_count._4_4_,0x3f800000);
      a._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      a._M_h._M_rehash_policy._4_4_ = 0;
      a._M_h._M_rehash_policy._M_next_resize = 0;
      auStack_128 = (undefined1  [8])0x0;
      outNodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      outNodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      peVar22 = ((__position._M_current)->
                super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __dest = (peVar22->tokens).
               super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppTVar29 = (peVar22->tokens).
                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (__dest != ppTVar29) {
        do {
          if (((long)ppTVar29 - (long)__dest < 9) || (pTVar3 = *__dest, pTVar3->sid != Annotation))
          {
            if ((auStack_128 !=
                 (undefined1  [8])
                 outNodes.
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) &&
               (std::
                _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::
                _M_emplace<chatra::Token_const*&,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>&>
                          ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)auStack_d8,__dest,auStack_128),
               psVar33 = outNodes.
                         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, auVar18 = auStack_128,
               auVar37 = auStack_128,
               (undefined1  [8])
               outNodes.
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start != auStack_128)) {
              do {
                p_Var5 = (((pointer)auVar37)->
                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                         _M_pi;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                auVar37 = (undefined1  [8])((long)auVar37 + 0x10);
              } while (auVar37 != (undefined1  [8])psVar33);
              outNodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar18;
            }
            __dest = __dest + 1;
          }
          else {
            _Var39._M_current = __dest + 1;
            if (__dest[1]->type != Name) {
              if (__dest[1]->sid == OpenBrace) {
                local_180 = (pointer)_Var39._M_current;
                if (__dest + 2 != ppTVar29) {
                  ct.sTable = (shared_ptr<chatra::StringTable> *)0x0;
                  stack.
                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  stack.
                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  lVar38 = 0x10;
                  do {
                    lVar20 = lVar38;
                    pTVar3 = *(Token **)((long)__dest + lVar20);
                    if (((pointer)ct.sTable ==
                         stack.
                         super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) &&
                       (lVar38 = lVar20, pTVar3->sid == CloseBrace)) goto LAB_00186b2d;
                    if (pTVar3->type == CloseBracket) {
                      SVar2 = pTVar3->sid;
                      if (SVar2 == CloseBrace) {
                        bVar19 = checkBracketPair((ParserContext *)
                                                  &outNodes.
                                                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,pTVar3,(
                                                  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                                  *)&ct.sTable,OpenBrace);
                      }
                      else if (SVar2 == CloseBracket) {
                        bVar19 = checkBracketPair((ParserContext *)
                                                  &outNodes.
                                                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,pTVar3,(
                                                  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                                  *)&ct.sTable,OpenBracket);
                      }
                      else {
                        if (SVar2 != CloseParenthesis) {
                          auStack_68 = (undefined1  [8])
                                       &n.
                                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount;
                          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi._0_6_ = 0x6e7265746e69;
                          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi._6_2_ = 0x6c61;
                          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                               (element_type *)0xe;
                          auStack_88 = (undefined1  [8])0x0;
                          it._M_current = (Token **)0x0;
                          local_78 = (Token *)0x0;
                          ParserContext::errorAtToken
                                    ((ParserContext *)
                                     &outNodes.
                                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,
                                     pTVar3,(string *)auStack_68,
                                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)auStack_88);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)auStack_88);
                          if (auStack_68 !=
                              (undefined1  [8])
                              &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount) {
                            operator_delete((void *)auStack_68);
                          }
                          puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                          *puVar31 = &PTR__exception_00243470;
                          __cxa_throw(puVar31,&AbortCompilingException::typeinfo,
                                      std::exception::~exception);
                        }
                        bVar19 = checkBracketPair((ParserContext *)
                                                  &outNodes.
                                                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,pTVar3,(
                                                  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                                  *)&ct.sTable,OpenParenthesis);
                      }
                      if (bVar19 == false) goto LAB_00186b20;
                    }
                    else if (pTVar3->type == OpenBracket) {
                      std::
                      vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      ::emplace_back<chatra::StringId_const&,chatra::Token_const*&>
                                ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                                  *)&ct.sTable,&pTVar3->sid,(Token **)((long)__dest + lVar20));
                    }
                    lVar38 = lVar20 + 8;
                  } while ((Token **)((long)__dest + lVar20 + 8) != ppTVar29);
                  if ((pointer)ct.sTable !=
                      stack.
                      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    pTVar3 = *(Token **)((long)__dest + lVar20);
                    local_1a0._16_7_ = 0x686374616d6e75;
                    uStack_189 = 0x27206465;
                    local_1a0._8_8_ = (_Elt_pointer)0xb;
                    uStack_185 = 0;
                    lVar20 = (ulong)stack.
                                    super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].first * 0x20;
                    local_158._0_8_ = local_158 + 0x10;
                    lVar38 = *(long *)((ct.errorReceiver)->_vptr_IErrorReceiver[8] + lVar20);
                    local_1a0._0_8_ = (_Elt_pointer)(local_1a0 + 0x10);
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_158,lVar38,
                               *(long *)((ct.errorReceiver)->_vptr_IErrorReceiver[8] + lVar20 + 8) +
                               lVar38);
                    pbVar35 = (pointer)0xf;
                    if ((_Elt_pointer)local_1a0._0_8_ != (_Elt_pointer)(local_1a0 + 0x10)) {
                      pbVar35 = (pointer)CONCAT17((undefined1)uStack_189,local_1a0._16_7_);
                    }
                    pbVar1 = (pointer)((long)&((_Alloc_hider *)local_158._8_8_)->_M_p +
                                      (long)&((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                               *)local_1a0._8_8_)->_M_ptr);
                    if (pbVar35 < pbVar1) {
                      pbVar35 = (pointer)0xf;
                      if ((_Elt_pointer)local_158._0_8_ != (_Elt_pointer)(local_158 + 0x10)) {
                        pbVar35 = (pointer)local_158._16_8_;
                      }
                      if (pbVar35 < pbVar1) goto LAB_001869c0;
                      plVar21 = (long *)std::__cxx11::string::replace
                                                  ((ulong)local_158,0,(char *)0x0,local_1a0._0_8_);
                    }
                    else {
LAB_001869c0:
                      plVar21 = (long *)std::__cxx11::string::_M_append(local_1a0,local_158._0_8_);
                    }
                    auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
                    pbVar35 = (pointer)(plVar21 + 2);
                    if ((pointer)*plVar21 == pbVar35) {
                      local_78 = (Token *)(pbVar35->_M_dataplus)._M_p;
                      ppsStack_70 = (_Map_pointer)plVar21[3];
                    }
                    else {
                      local_78 = (Token *)(pbVar35->_M_dataplus)._M_p;
                      auStack_88 = (undefined1  [8])*plVar21;
                    }
                    it._M_current = (Token **)plVar21[1];
                    *plVar21 = (long)pbVar35;
                    plVar21[1] = 0;
                    *(undefined1 *)&(pbVar35->_M_dataplus)._M_p = 0;
                    puVar31 = (undefined8 *)std::__cxx11::string::append(auStack_88);
                    auStack_68 = (undefined1  [8])
                                 &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount;
                    p_Var25 = (_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                               *)(puVar31 + 2);
                    if ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)*puVar31 == p_Var25) {
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._0_6_ = (undefined6)*(undefined8 *)p_Var25;
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._6_2_ = (undefined2)((ulong)*(undefined8 *)p_Var25 >> 0x30);
                    }
                    else {
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._0_6_ = (undefined6)*(undefined8 *)p_Var25;
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._6_2_ = (undefined2)((ulong)*(undefined8 *)p_Var25 >> 0x30);
                      auStack_68 = (undefined1  [8])*puVar31;
                    }
                    n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)puVar31[1];
                    *puVar31 = p_Var25;
                    puVar31[1] = 0;
                    *(undefined1 *)(puVar31 + 2) = 0;
                    local_1b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_1b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_1b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    ParserContext::errorAtNextToken
                              ((ParserContext *)
                               &outNodes.
                                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar3,
                               (string *)auStack_68,&local_1b8);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_1b8);
                    if (auStack_68 !=
                        (undefined1  [8])
                        &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
                    {
                      operator_delete((void *)auStack_68);
                    }
                    if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
                      operator_delete((void *)auStack_88);
                    }
                    if ((_Elt_pointer)local_158._0_8_ != (_Elt_pointer)(local_158 + 0x10)) {
                      operator_delete((void *)local_158._0_8_);
                    }
                    if ((_Elt_pointer)local_1a0._0_8_ != (_Elt_pointer)(local_1a0 + 0x10)) {
                      operator_delete((void *)local_1a0._0_8_);
                    }
LAB_00186b20:
                    lVar38 = 0x10;
                  }
LAB_00186b2d:
                  if (ct.sTable != (shared_ptr<chatra::StringTable> *)0x0) {
                    operator_delete(ct.sTable);
                  }
                  if (((lVar38 != 0x10) &&
                      (_Var39._M_current = lVar38 + __dest,
                      _Var39._M_current !=
                      ((((__position._M_current)->
                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      tokens).
                      super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish)) &&
                     ((*_Var39._M_current)->sid == CloseBrace)) {
                    this_00 = &aMap._M_h._M_single_bucket;
                    parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                              ((chatra *)this_00,
                               (ParserContext *)
                               &outNodes.
                                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (__normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                                )(__dest + 2),_Var39);
                    wrapByTuple((chatra *)auStack_68,(shared_ptr<chatra::Node> *)this_00,
                                (Token *)0x0);
                    if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
                    }
                    std::
                    vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    ::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                              ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                                *)auStack_128,
                               outNodes.
                               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               *(undefined8 *)((long)auStack_68 + 0x60),
                               *(undefined8 *)((long)auStack_68 + 0x68));
                    ppTVar29 = _Var39._M_current + 1;
                    if (__dest != ppTVar29) {
                      peVar22 = ((__position._M_current)->
                                super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      ;
                      sVar28 = (long)(peVar22->tokens).
                                     super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar29;
                      ppTVar26 = ppTVar29;
                      if (sVar28 != 0) {
                        memmove(__dest,ppTVar29,sVar28);
                        ppTVar26 = (peVar22->tokens).
                                   super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                      }
                      ppTVar29 = (Token **)((long)__dest + ((long)ppTVar26 - (long)ppTVar29));
                      if (ppTVar26 != ppTVar29) {
                        (peVar22->tokens).
                        super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish = ppTVar29;
                      }
                    }
                    if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                        (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
                    }
                    goto LAB_001867c1;
                  }
                }
                pTVar3 = *(Token **)local_180;
                auStack_68 = (undefined1  [8])
                             &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount;
                auStack_88 = (undefined1  [8])0x13;
                auStack_68 = (undefined1  [8])
                             std::__cxx11::string::_M_create((ulong *)auStack_68,(ulong)auStack_88);
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _0_6_ = auStack_88._0_6_;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _6_2_ = auStack_88._6_2_;
                *(undefined8 *)auStack_68 = 0x6465746365707865;
                *(undefined8 *)((long)auStack_68 + 8) = 0x7461746f6e6e6120;
                *(undefined4 *)((long)auStack_68 + 0xf) = 0x6e6f6974;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auStack_88;
                *(_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)((long)auStack_68 + (long)auStack_88) =
                     (_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      )0x0;
                auStack_88 = (undefined1  [8])0x0;
                it._M_current = (Token **)0x0;
                local_78 = (Token *)0x0;
                ParserContext::errorAtNextToken
                          ((ParserContext *)
                           &outNodes.
                            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar3,
                           (string *)auStack_68,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_88);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_88);
                if (auStack_68 ==
                    (undefined1  [8])
                    &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
                break;
              }
              else {
                auStack_68 = (undefined1  [8])
                             &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount;
                auStack_88 = (undefined1  [8])0x1f;
                auStack_68 = (undefined1  [8])
                             std::__cxx11::string::_M_create((ulong *)auStack_68,(ulong)auStack_88);
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _0_6_ = auStack_88._0_6_;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _6_2_ = auStack_88._6_2_;
                *(undefined8 *)((long)auStack_68 + 0xf) = 0x6d616e206e6f6974;
                *(undefined8 *)((long)auStack_68 + 0x17) = 0x227b2220726f2065;
                *(undefined8 *)auStack_68 = 0x6465746365707865;
                *(undefined8 *)((long)auStack_68 + 8) = 0x7461746f6e6e6120;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auStack_88;
                *(_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)((long)auStack_68 + (long)auStack_88) =
                     (_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      )0x0;
                auStack_88 = (undefined1  [8])0x0;
                it._M_current = (Token **)0x0;
                local_78 = (Token *)0x0;
                ParserContext::errorAtToken
                          ((ParserContext *)
                           &outNodes.
                            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar3,
                           (string *)auStack_68,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_88);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_88);
                if (auStack_68 ==
                    (undefined1  [8])
                    &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
                break;
              }
              operator_delete((void *)auStack_68);
              break;
            }
            last._M_current = __dest + 2;
            parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                      ((chatra *)auStack_68,
                       (ParserContext *)
                       &outNodes.
                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,_Var39,last);
            std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
            ::emplace_back<std::shared_ptr<chatra::Node>>
                      ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                        *)auStack_128,(shared_ptr<chatra::Node> *)auStack_68);
            if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            }
            peVar22 = ((__position._M_current)->
                      super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            sVar28 = (long)(peVar22->tokens).
                           super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)last._M_current;
            _Var39._M_current = last._M_current;
            if (sVar28 != 0) {
              memmove(__dest,last._M_current,sVar28);
              _Var39._M_current =
                   (peVar22->tokens).
                   super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            }
            ppTVar29 = (Token **)((long)__dest + ((long)_Var39._M_current - (long)last._M_current));
            if (_Var39._M_current != ppTVar29) {
              (peVar22->tokens).
              super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppTVar29;
            }
          }
LAB_001867c1:
          ppTVar29 = ((((__position._M_current)->
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tokens
                     ).
                     super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        } while (__dest != ppTVar29);
      }
      node = local_130;
      if (auStack_128 !=
          (undefined1  [8])
          outNodes.
          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (a._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
          auStack_68 = (undefined1  [8])0x0;
          std::
          _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<decltype(nullptr),std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                    ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)auStack_d8,auStack_68,auStack_128);
        }
        else {
          pTVar3 = *(((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_128)->_M_ptr
                    ->tokens).
                    super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar4 = ((outNodes.
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].
                     super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokens).
                   super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
          auStack_68 = (undefined1  [8])
                       &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          auStack_88 = (undefined1  [8])0x1d;
          auStack_68 = (undefined1  [8])
                       std::__cxx11::string::_M_create((ulong *)auStack_68,(ulong)auStack_88);
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_6_ =
               auStack_88._0_6_;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ =
               auStack_88._6_2_;
          *(undefined8 *)((long)auStack_68 + 0xd) = 0x6e6120666f207465;
          *(undefined8 *)((long)auStack_68 + 0x15) = 0x6e6f697461746f6e;
          *(undefined8 *)auStack_68 = 0x6465746365707865;
          *(undefined8 *)((long)auStack_68 + 8) = 0x2074656772617420;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)auStack_88;
          *(_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)((long)auStack_68 + (long)auStack_88) =
               (_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                )0x0;
          auStack_88 = (undefined1  [8])0x0;
          it._M_current = (Token **)0x0;
          local_78 = (Token *)0x0;
          ParserContext::errorAtToken
                    ((ParserContext *)
                     &outNodes.
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar3,pTVar4,
                     (string *)auStack_68,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_88);
          node = local_130;
          if (auStack_68 !=
              (undefined1  [8])
              &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
            operator_delete((void *)auStack_68);
          }
        }
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               *)auStack_128);
      if ((a._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) ||
         (peVar22 = ((__position._M_current)->
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
         (peVar22->tokens).
         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (peVar22->tokens).
         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        puVar31 = (undefined8 *)a._M_h._M_bucket_count;
        auVar18 = (undefined1  [8])local_220;
        if (auStack_178 !=
            (undefined1  [8])
            pending.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          auStack_68 = (undefined1  [8])
                       ((__position._M_current)->
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::
          _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<chatra::Node*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>&>
                    ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_220,auStack_68,auStack_178);
          psVar33 = pending.
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          auVar37 = auStack_178;
          puVar31 = (undefined8 *)a._M_h._M_bucket_count;
          auVar40 = auStack_178;
          if ((undefined1  [8])
              pending.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start != auStack_178) {
            do {
              p_Var5 = (((pointer)auVar40)->
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                       _M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              auVar40 = (undefined1  [8])((long)auVar40 + 0x10);
            } while (auVar40 != (undefined1  [8])psVar33);
            pending.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar37;
            puVar31 = (undefined8 *)a._M_h._M_bucket_count;
          }
        }
        for (; auStack_68 = auVar18, puVar31 != (undefined8 *)0x0; puVar31 = (undefined8 *)*puVar31)
        {
          std::
          _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_insert<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,false>>>>
                    ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_220,puVar31 + 1,auStack_68);
          auVar18 = auStack_68;
        }
        __position._M_current = __position._M_current + 1;
        node = local_130;
      }
      else {
        __position = std::
                     vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ::_M_erase(this,__position);
        auStack_88 = (undefined1  [8])0x0;
        pmVar23 = std::__detail::
                  _Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)auStack_d8,(key_type *)auStack_88);
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  *)auStack_68,pmVar23);
        std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                  ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_178,
                   pending.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,auStack_68,
                   n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)auStack_68);
      }
      std::
      _Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)auStack_d8);
    } while (__position._M_current !=
             (node->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_178);
  replaceSyntaxSugar((ParserContext *)
                     &outNodes.
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(AnnotationMap *)local_220,
                     node);
  auStack_128 = (undefined1  [8])0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar33 = (node->blockNodes).
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_180 = (node->blockNodes).
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar33 != local_180) {
    do {
      peVar22 = (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar41 = (size_type *)((ulong)((uint)peVar22->type * 0x28) + stAttrs);
      peVar6 = (peVar22->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar6 != (element_type *)0x0) && (peVar6->containsError == true)) {
        auStack_d8 = (undefined1  [8])&a._M_h._M_bucket_count;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_d8,
                   "interpreter reached at the line which contains error on lexical analysis","");
        auStack_68 = (undefined1  [8])0x0;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_6_ = 0;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ = 0;
        peVar6 = (peVar22->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        (**(code **)(*(long *)ct.ws + 0x10))
                  (ct.ws,2,&peVar6->fileName,peVar6->lineNo,&peVar6->line,0xffffffffffffffff,
                   0xffffffffffffffff,(string *)auStack_d8,auStack_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_68);
        if (auStack_d8 != (undefined1  [8])&a._M_h._M_bucket_count) {
          operator_delete((void *)auStack_d8);
        }
        puVar31 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar31 = &PTR__exception_00243470;
        __cxa_throw(puVar31,&AbortCompilingException::typeinfo,std::exception::~exception);
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      resize(&peVar22->subNodes,*psVar41);
      peVar22 = (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      auStack_88 = (undefined1  [8])
                   ((peVar22->tokens).
                    super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + psVar41[1]);
      pSVar7 = (StatementPatternElement *)psVar41[3];
      if ((StatementPatternElement *)psVar41[2] == pSVar7) {
LAB_001870fb:
        if (auStack_88 ==
            (undefined1  [8])
            (peVar22->tokens).
            super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          NVar24 = peVar22->type;
          if (NVar24 == Def) {
            auStack_d8 = (undefined1  [8])&a._M_h._M_bucket_count;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)auStack_d8,"expected \".name(parameters)\"","");
            bVar19 = checkCombination((ParserContext *)
                                      &outNodes.
                                       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (((psVar33->
                                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->subNodes).
                                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,4,5,
                                      (string *)auStack_d8);
            if (auStack_d8 != (undefined1  [8])&a._M_h._M_bucket_count) {
              operator_delete((void *)auStack_d8);
            }
            if (!bVar19) goto LAB_0018757e;
            peVar22 = (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            NVar24 = peVar22->type;
          }
          if (NVar24 == Class) {
            auStack_d8 = (undefined1  [8])&a._M_h._M_bucket_count;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)auStack_d8,"expected \"extends base-classes,...\"","");
            bVar19 = checkCombination((ParserContext *)
                                      &outNodes.
                                       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (((psVar33->
                                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->subNodes).
                                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,2,3,
                                      (string *)auStack_d8);
            if (auStack_d8 != (undefined1  [8])&a._M_h._M_bucket_count) {
              operator_delete((void *)auStack_d8);
            }
            if (!bVar19) goto LAB_0018757e;
            peVar22 = (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            NVar24 = peVar22->type;
          }
          if (NVar24 == Def) {
            psVar9 = (peVar22->subNodes).
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar38 = *(long *)&psVar9[6].
                               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
            if (lVar38 != 0) {
              psVar10 = (peVar22->blockNodes).
                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (psVar10 ==
                  (peVar22->blockNodes).
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                if (1 < peVar22->sid - Init) goto LAB_001873e0;
                pTVar3 = (Token *)**(undefined8 **)(lVar38 + 0x18);
                auStack_d8 = (undefined1  [8])&a._M_h._M_bucket_count;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)auStack_d8,"\"init\" and \"deinit\" cannot be deleted method",
                           "");
                auStack_68 = (undefined1  [8])0x0;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _0_6_ = 0;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _6_2_ = 0;
                ParserContext::errorAtToken
                          ((ParserContext *)
                           &outNodes.
                            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar3,
                           (string *)auStack_d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_68);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_68);
                if (auStack_d8 != (undefined1  [8])&a._M_h._M_bucket_count) goto LAB_00187174;
              }
              else {
                peVar22 = (psVar10->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
                auStack_d8 = (undefined1  [8])&a._M_h._M_bucket_count;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)auStack_d8,"deleted method cannot have nested block","");
                auStack_68 = (undefined1  [8])0x0;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _0_6_ = 0;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _6_2_ = 0;
                peVar6 = (peVar22->line).
                         super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                (**(code **)(*(long *)ct.ws + 0x10))
                          (ct.ws,2,&peVar6->fileName,peVar6->lineNo,&peVar6->line,0xffffffffffffffff
                           ,0xffffffffffffffff,(string *)auStack_d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_68);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_68);
                if (auStack_d8 != (undefined1  [8])&a._M_h._M_bucket_count) {
LAB_00187174:
                  operator_delete((void *)auStack_d8);
                }
              }
              goto LAB_0018757e;
            }
LAB_001873e0:
            lVar38 = *(long *)&psVar9->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
            if (lVar38 != 0) {
              pTVar3 = (Token *)**(undefined8 **)(lVar38 + 0x18);
              auStack_d8 = (undefined1  [8])&a._M_h._M_bucket_count;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)auStack_d8,
                         "static qualifier is reserved keyword, currently not working","");
              auStack_68 = (undefined1  [8])0x0;
              n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_6_
                   = 0;
              n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_
                   = 0;
              ParserContext::errorAtToken
                        ((ParserContext *)
                         &outNodes.
                          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,Warning,pTVar3,
                         (string *)auStack_d8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_68);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_68);
              if (auStack_d8 != (undefined1  [8])&a._M_h._M_bucket_count) {
                operator_delete((void *)auStack_d8);
              }
              peVar22 = (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr;
              NVar24 = peVar22->type;
              goto LAB_00187465;
            }
LAB_001874fc:
            lVar38 = *(long *)&(peVar22->subNodes).
                               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[7].
                               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
            if (lVar38 != 0) {
              puVar11 = *(undefined8 **)(lVar38 + 0x68);
              for (puVar31 = *(undefined8 **)(lVar38 + 0x60); puVar31 != puVar11;
                  puVar31 = puVar31 + 2) {
                pcVar12 = (char *)*puVar31;
                if ((*pcVar12 != '\x1b') || (*(int *)(pcVar12 + 0x34) != 0x67)) {
                  pTVar3 = (Token *)**(undefined8 **)(pcVar12 + 0x18);
                  pTVar4 = *(Token **)(*(long *)(pcVar12 + 0x20) + -8);
                  auStack_d8 = (undefined1  [8])&a._M_h._M_bucket_count;
                  auStack_68 = (undefined1  [8])0x13;
                  auStack_d8 = (undefined1  [8])
                               std::__cxx11::string::_M_create
                                         ((ulong *)auStack_d8,(ulong)auStack_68);
                  a._M_h._M_bucket_count = (size_type)auStack_68;
                  *(undefined8 *)auStack_d8 = 0x6465746365707865;
                  pcVar12 = (char *)((long)auStack_d8 + 8);
                  pcVar12[0] = ' ';
                  pcVar12[1] = 'q';
                  pcVar12[2] = 'u';
                  pcVar12[3] = 'a';
                  pcVar12[4] = 'l';
                  pcVar12[5] = 'i';
                  pcVar12[6] = 'f';
                  pcVar12[7] = 'i';
                  builtin_strncpy((char *)((long)auStack_d8 + 0xf),"iers",4);
                  a._M_h._M_buckets = (__buckets_ptr)auStack_68;
                  *(char *)((long)auStack_d8 + (long)auStack_68) = '\0';
                  auStack_68 = (undefined1  [8])0x0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _0_6_ = 0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _6_2_ = 0;
                  ParserContext::errorAtToken
                            ((ParserContext *)
                             &outNodes.
                              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar3,pTVar4
                             ,(string *)auStack_d8,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)auStack_68);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)auStack_68);
                  if (auStack_d8 == (undefined1  [8])&a._M_h._M_bucket_count) goto LAB_0018757e;
                  goto LAB_00187174;
                }
                *(byte *)&peVar22->flags = (byte)peVar22->flags | 1;
              }
            }
          }
          else {
LAB_00187465:
            if (NVar24 == Class) {
              lVar38 = *(long *)&((peVar22->subNodes).
                                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
              if (lVar38 != 0) {
                pTVar3 = (Token *)**(undefined8 **)(lVar38 + 0x18);
                auStack_d8 = (undefined1  [8])&a._M_h._M_bucket_count;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)auStack_d8,
                           "static qualifier is reserved keyword, currently not working","");
                auStack_68 = (undefined1  [8])0x0;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _0_6_ = 0;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _6_2_ = 0;
                ParserContext::errorAtToken
                          ((ParserContext *)
                           &outNodes.
                            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,Warning,pTVar3,
                           (string *)auStack_d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_68);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_68);
                if (auStack_d8 != (undefined1  [8])&a._M_h._M_bucket_count) {
                  operator_delete((void *)auStack_d8);
                }
                peVar22 = (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
                NVar24 = peVar22->type;
                goto LAB_001874f7;
              }
            }
            else {
LAB_001874f7:
              if (NVar24 == Def) goto LAB_001874fc;
            }
          }
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     *)auStack_128,psVar33);
          if ((char)local_134 == '\0') {
            node_00 = (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            NVar24 = node_00->type;
            if ((NVar24 == IfGroup) || (NVar24 == Sync)) {
              parseInnerNode(ws,errorReceiver,sTable,node_00,false);
              LOCK();
              (((psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              blockNodesState)._M_i = Parsed;
              UNLOCK();
            }
          }
        }
        else {
          pTVar3 = *(Token **)auStack_88;
          auStack_d8 = (undefined1  [8])&a._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>((string *)auStack_d8,"extra token","");
          auStack_68 = (undefined1  [8])0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_6_ = 0
          ;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ = 0
          ;
          ParserContext::errorAtToken
                    ((ParserContext *)
                     &outNodes.
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar3,
                     (string *)auStack_d8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_68);
          if (auStack_d8 != (undefined1  [8])&a._M_h._M_bucket_count) goto LAB_00187174;
        }
      }
      else {
        bVar19 = false;
        e = (StatementPatternElement *)psVar41[2];
        do {
          last_00._M_current =
               (((psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               tokens).
               super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (auStack_88 == (undefined1  [8])last_00._M_current) {
            if (e->required == true) {
              auStack_d8 = (undefined1  [8])0x0;
              a._M_h._M_buckets = (__buckets_ptr)0x0;
              a._M_h._M_bucket_count = 0;
              ParserContext::errorAtNextToken
                        ((ParserContext *)
                         &outNodes.
                          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,
                         last_00._M_current[-1],&e->errorMessage,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_d8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_d8);
              goto LAB_0018757e;
            }
          }
          else {
            extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                      ((chatra *)auStack_d8,
                       (ParserContext *)
                       &outNodes.
                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                        *)auStack_88,last_00,e);
            pp_Var17 = a._M_h._M_buckets;
            auVar18 = auStack_d8;
            if (auStack_d8 == (undefined1  [8])0x0) {
              if (e->required == false) goto LAB_001870b6;
              bVar19 = true;
              bVar16 = false;
            }
            else {
              sVar8 = e->subNodeIndex;
              if (sVar8 != 0xffffffffffffffff) {
                psVar9 = (((psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->subNodes).
                         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                auStack_d8 = (undefined1  [8])0x0;
                a._M_h._M_buckets = (__buckets_ptr)0x0;
                *(undefined1 (*) [8])
                 &psVar9[sVar8].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> =
                     auVar18;
                this_01._M_pi =
                     *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar9 + sVar8) + 8);
                *(__buckets_ptr *)((long)(psVar9 + sVar8) + 8) = pp_Var17;
                if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
                }
              }
LAB_001870b6:
              bVar16 = true;
            }
            if (a._M_h._M_buckets != (__buckets_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a._M_h._M_buckets);
            }
            if (!bVar16) break;
          }
          pSVar32 = e + 1;
          e = e + 1;
        } while (pSVar32 != pSVar7);
        if (!bVar19) {
          peVar22 = (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          goto LAB_001870fb;
        }
      }
LAB_0018757e:
      psVar33 = psVar33 + 1;
    } while (psVar33 != local_180);
  }
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  operator=(this,(vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  *)auStack_128);
  auStack_68 = (undefined1  [8])&p_Stack_38;
  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x1;
  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_6_ = 0;
  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  if (aMap._M_h._M_bucket_count != 0) {
    plVar21 = (long *)aMap._M_h._M_bucket_count;
    do {
      auStack_d8 = (undefined1  [8])0xffffffffffffffff;
      a._M_h._M_buckets = (__buckets_ptr)0x0;
      std::
      _Hashtable<void_const*,std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>,std::allocator<std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<void_const*const&,std::pair<unsigned_long,decltype(nullptr)>>
                ((_Hashtable<void_const*,std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>,std::allocator<std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)auStack_68,plVar21 + 1,auStack_d8);
      plVar21 = (long *)*plVar21;
    } while (plVar21 != (long *)0x0);
  }
  a._M_h._M_rehash_policy._M_next_resize = 0;
  a._M_h._M_single_bucket = (__node_base_ptr)0x0;
  a._M_h._M_element_count = 0;
  a._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  a._M_h._M_rehash_policy._4_4_ = 0;
  a._M_h._M_bucket_count = 0;
  a._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  auStack_d8 = (undefined1  [8])0x0;
  a._M_h._M_buckets = (__buckets_ptr)0x0;
  std::_Deque_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     *)auStack_d8,0);
  psVar33 = (local_130->blockNodes).
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar9 = (local_130->blockNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar33 != psVar9) {
    do {
      std::deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      push_back((deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)auStack_d8,psVar33);
      peVar22 = (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar22 != (element_type *)0x0) && (peVar22->type == IfGroup)) {
        auStack_88 = (undefined1  [8])a._M_h._M_rehash_policy._M_next_resize;
        it._M_current = (Token **)a._M_h._M_single_bucket;
        local_78 = (Token *)0x0;
        ppsStack_70 = (_Map_pointer)0x0;
        std::deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,void>
                  ((iterator *)local_1a0,
                   (deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_d8,(const_iterator *)auStack_88,
                   (peVar22->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (peVar22->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      psVar33 = psVar33 + 1;
    } while (psVar33 != psVar9);
  }
  if (a._M_h._M_rehash_policy._M_next_resize != a._M_h._M_bucket_count) {
    do {
      uVar30 = (long)(a._M_h._M_bucket_count - (long)a._M_h._M_before_begin._M_nxt) >> 4;
      if ((long)uVar30 < 0) {
        uVar34 = (long)(a._M_h._M_bucket_count - (long)a._M_h._M_before_begin._M_nxt) >> 9;
LAB_001877b1:
        puVar31 = (undefined8 *)
                  ((uVar30 + uVar34 * -0x20) * 0x10 +
                  *(long *)(a._M_h._M_rehash_policy._0_8_ + uVar34 * 8));
      }
      else {
        puVar31 = (undefined8 *)a._M_h._M_bucket_count;
        if (0x1f < uVar30) {
          uVar34 = uVar30 >> 5;
          goto LAB_001877b1;
        }
      }
      ct.sTable = (shared_ptr<chatra::StringTable> *)*puVar31;
      stack.
      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar31[1];
      if (stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(stack.
                    super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second =
               *(int *)&(stack.
                         super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second + 1;
          UNLOCK();
        }
        else {
          *(int *)&(stack.
                    super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second =
               *(int *)&(stack.
                         super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second + 1;
        }
      }
      std::deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      pop_front((deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)auStack_d8);
      if (ct.sTable != (shared_ptr<chatra::StringTable> *)0x0) {
        if (*(long **)((long)auStack_68 +
                      ((ulong)ct.sTable %
                      (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      * 8) != (long *)0x0) {
          plVar21 = (long *)**(long **)((long)auStack_68 +
                                       ((ulong)ct.sTable %
                                       (ulong)n.
                                              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr) * 8);
          psVar13 = (shared_ptr<chatra::StringTable> *)plVar21[1];
          while (ct.sTable != psVar13) {
            plVar21 = (long *)*plVar21;
            if ((plVar21 == (long *)0x0) ||
               (psVar13 = (shared_ptr<chatra::StringTable> *)plVar21[1],
               (ulong)psVar13 %
               (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (ulong)ct.sTable %
               (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr))
            goto LAB_0018786f;
          }
          plVar21[2] = 0;
          plVar21[3] = (long)ct.sTable;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar21 + 4),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack);
        }
LAB_0018786f:
        peVar14 = ct.sTable[2].super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        for (peVar36 = (element_type *)
                       ct.sTable[1].
                       super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi; peVar36 != peVar14;
            peVar36 = (element_type *)&peVar36->strToId) {
          uVar30 = (ulong)*(_Hash_node_base **)&peVar36->baseVersion %
                   (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (*(__node_base_ptr *)((long)auStack_68 + uVar30 * 8) != (__node_base_ptr)0x0) {
            p_Var15 = (*(__node_base_ptr *)((long)auStack_68 + uVar30 * 8))->_M_nxt;
            p_Var27 = p_Var15[1]._M_nxt;
            while (*(_Hash_node_base **)&peVar36->baseVersion != p_Var27) {
              p_Var15 = p_Var15->_M_nxt;
              if ((p_Var15 == (_Hash_node_base *)0x0) ||
                 (p_Var27 = p_Var15[1]._M_nxt,
                 (ulong)p_Var27 %
                 (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                 uVar30)) goto LAB_001878f4;
            }
            p_Var27 = (_Hash_node_base *)
                      ((long)ct.sTable[2].
                             super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr -
                       (long)ct.sTable[1].
                             super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi >> 3);
            if (p_Var27 <= p_Var15[2]._M_nxt) {
              p_Var15[2]._M_nxt = p_Var27;
              p_Var15[3]._M_nxt = (_Hash_node_base *)ct.sTable;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var15 + 4),
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack);
            }
          }
LAB_001878f4:
        }
        local_1a0._16_7_ = 0;
        uStack_189 = 0;
        uStack_185 = 0;
        uStack_184 = 0;
        local_1a0._0_8_ = a._M_h._M_rehash_policy._M_next_resize;
        local_1a0._8_8_ = a._M_h._M_single_bucket;
        std::deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,void>
                  ((iterator *)local_158,
                   (deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_d8,(const_iterator *)local_1a0,
                   (shared_ptr<chatra::Node> *)
                   ct.sTable[6].super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(shared_ptr<chatra::Node> *)
                          ct.sTable[6].
                          super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
      }
      if (stack.
          super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stack.
                   super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
    } while (a._M_h._M_rehash_policy._M_next_resize != a._M_h._M_bucket_count);
  }
  plVar21 = (long *)CONCAT26(n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._6_2_,
                             n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_6_);
  if (plVar21 != (long *)0x0) {
    do {
      pmVar23 = std::__detail::
                _Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_220,(key_type *)(plVar21 + 1));
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              *)&ct.sTable,pmVar23);
      if (plVar21[2] == -1) {
        pTVar3 = (Token *)(((((ct.sTable)->
                             super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->strToId)._M_h._M_before_begin._M_nxt)->_M_nxt;
        local_158._0_8_ = local_158 + 0x10;
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f;
        local_158._0_8_ = std::__cxx11::string::_M_create((ulong *)local_158,(ulong)&local_1b8);
        local_158._16_8_ =
             local_1b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        builtin_strncpy((char *)((long)&(((_Elt_pointer)(local_158._0_8_ + 0x20))->
                                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_refcount._M_pi + 7)," start f",8);
        builtin_strncpy((char *)((long)&(((_Elt_pointer)(local_158._0_8_ + 0x30))->
                                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + 7),"rom here",8);
        (((_Elt_pointer)(local_158._0_8_ + 0x20))->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x6f6e6e6120656874;
        (((_Elt_pointer)(local_158._0_8_ + 0x20))->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x20736e6f69746174;
        (((_Elt_pointer)(local_158._0_8_ + 0x10))->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x746169636f737361;
        (((_Elt_pointer)(local_158._0_8_ + 0x10))->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2068746977206465;
        (((_Elt_pointer)local_158._0_8_)->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x7469746e65206f6e;
        (((_Elt_pointer)local_158._0_8_)->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x20646e756f662079;
        local_158._8_8_ =
             local_1b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(undefined1 *)
         ((long)&(((_Elt_pointer)local_158._0_8_)->
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         (long)&((local_1b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p) = 0;
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ParserContext::errorAtToken
                  ((ParserContext *)
                   &outNodes.
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar3,
                   (string *)local_158,&local_1b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1b8);
        if ((_Elt_pointer)local_158._0_8_ != (_Elt_pointer)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_);
        }
      }
      else {
        std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                  ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)(plVar21[3] + 0x78),*(undefined8 *)(plVar21[3] + 0x80),ct.sTable,
                   stack.
                   super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               *)&ct.sTable);
      plVar21 = (long *)*plVar21;
    } while (plVar21 != (long *)0x0);
  }
  std::deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::~deque
            ((deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              *)auStack_d8);
  std::
  _Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)auStack_68);
  if ((char)local_134 != '\0') {
    psVar9 = (local_130->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar33 = (local_130->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar33 != psVar9;
        psVar33 = psVar33 + 1) {
      parseInnerNode(ws,errorReceiver,sTable,
                     (psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     true);
      LOCK();
      (((psVar33->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      blockNodesState)._M_i = Parsed;
      UNLOCK();
    }
  }
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_128);
  std::
  _Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_220);
  return;
}

Assistant:

void parseInnerNode(ParserWorkingSet& ws, IErrorReceiver& errorReceiver,
		std::shared_ptr<StringTable>& sTable, Node* node, bool recursive) {

	chatra_assert(node->blockNodes.empty() || node->blockNodesState == NodeState::Structured);

	ParserContext ct(&ws, errorReceiver, sTable);

	auto aMap = parseInnerAnnotations(ct, node);
	replaceSyntaxSugar(ct, aMap, node);

	std::vector<std::shared_ptr<Node>> outNodes;
	for (auto& n : node->blockNodes) {
		auto& attr = getStAttr(n->type);

		if (n->line && n->line->containsError) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "interpreter reached at the line which contains error on lexical analysis", {});
			throw AbortCompilingException();
		}

		// Parse subNodes
		n->subNodes.resize(attr.subNodes);

		auto it = n->tokens.cbegin() + attr.skipTokens;
		bool hasError = false;
		for (auto& e : attr.pattern) {
			if (it == n->tokens.cend()) {
				if (!e.required)
					continue;
				chatra_assert(!e.errorMessage.empty());
				ct.errorAtNextToken(ErrorLevel::Error, *n->tokens.back(), e.errorMessage, {});
				hasError = true;
				break;
			}

			auto subNode = extractStatementPiece(ct, it, n->tokens.cend(), e);
			if (subNode) {
				if (e.subNodeIndex != SIZE_MAX) {
					chatra_assert(e.subNodeIndex < n->subNodes.size() && !n->subNodes[e.subNodeIndex]);
					n->subNodes[e.subNodeIndex] = std::move(subNode);
				}
			}
			else if (e.required) {
				hasError = true;
				break;
			}
		}
		if (hasError)
			continue;

		if (it != n->tokens.cend()) {
			ct.errorAtToken(ErrorLevel::Error, **it, "extra token", {});
			continue;
		}

		// Combination check
		if (n->type == NodeType::Def && !checkCombination(ct, n,
				SubNode::Def_Operator, SubNode::Def_OperatorParameter, "expected \".name(parameters)\""))
			continue;
		if (n->type == NodeType::Class && !checkCombination(ct, n,
				SubNode::Class_Extends, SubNode::Class_BaseClassList, "expected \"extends base-classes,...\""))
			continue;
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Delete] && !n->blockNodes.empty()) {
			ct.errorAtLine(ErrorLevel::Error, n->blockNodes[0]->line, "deleted method cannot have nested block", {});
			continue;
		}
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Delete] &&
				(n->sid == StringId::Init || n->sid == StringId::Deinit)) {
			ct.errorAtToken(ErrorLevel::Error, *n->subNodes[SubNode::Def_Delete]->tokens[0],
					R"("init" and "deinit" cannot be deleted method)", {});
			continue;
		}
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Static]) {
			ct.errorAtToken(ErrorLevel::Warning, *n->subNodes[SubNode::Def_Static]->tokens[0],
					"static qualifier is reserved keyword, currently not working", {});
		}
		if (n->type == NodeType::Class && n->subNodes[SubNode::Class_Static]) {
			ct.errorAtToken(ErrorLevel::Warning, *n->subNodes[SubNode::Class_Static]->tokens[0],
					"static qualifier is reserved keyword, currently not working", {});
		}

		// Additional process (set flags, etc)
		if (n->type == NodeType::Def && !qualifyDef(ct, n))
			continue;

		outNodes.push_back(n);

		if (!recursive) {
			if (n->type == NodeType::Sync || n->type == NodeType::IfGroup) {
				parseInnerNode(ws, errorReceiver, sTable, n.get(), false);
				n->blockNodesState = NodeState::Parsed;
			}
		}
	}

	node->blockNodes = outNodes;
	mapAnnotations(ct, aMap, node);

	if (recursive) {
		for (auto& n : node->blockNodes) {
			parseInnerNode(ws, errorReceiver, sTable, n.get(), true);
			n->blockNodesState = NodeState::Parsed;
		}
	}

	// node->blockNodesState = NodeState::Parsed;
}